

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

ostream * doctest::anon_unknown_15::operator<<(ostream *os,XmlEncode *xmlEncode)

{
  XmlEncode *xmlEncode_local;
  ostream *os_local;
  
  XmlEncode::encodeTo(xmlEncode,os);
  return os;
}

Assistant:

std::ostream& operator << ( std::ostream& os, XmlEncode const& xmlEncode ) {
        xmlEncode.encodeTo( os );
        return os;
    }